

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLineNurbs::ChLineNurbs(ChLineNurbs *this,ChLineNurbs *source)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index index;
  ulong uVar13;
  long lVar14;
  Index size;
  ActualDstType actualDst;
  Index size_1;
  ActualDstType actualDst_1;
  
  ChLine::ChLine(&this->super_ChLine,&source->super_ChLine);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineNurbs_00b3dfa8;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->points,&source->points);
  this->p = source->p;
  pdVar3 = (source->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar4 = (source->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar4) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4,1
              );
    if ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar4) goto LAB_007ff6f7;
  }
  pdVar5 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar13 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar13 = uVar4;
  }
  uVar13 = uVar13 & 0xfffffffffffffff8;
  if (7 < (long)uVar4) {
    lVar14 = 0;
    do {
      pdVar1 = pdVar3 + lVar14;
      dVar6 = pdVar1[1];
      dVar7 = pdVar1[2];
      dVar8 = pdVar1[3];
      dVar9 = pdVar1[4];
      dVar10 = pdVar1[5];
      dVar11 = pdVar1[6];
      dVar12 = pdVar1[7];
      pdVar2 = pdVar5 + lVar14;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar6;
      pdVar2[2] = dVar7;
      pdVar2[3] = dVar8;
      pdVar2[4] = dVar9;
      pdVar2[5] = dVar10;
      pdVar2[6] = dVar11;
      pdVar2[7] = dVar12;
      lVar14 = lVar14 + 8;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar4) {
    do {
      pdVar5[uVar13] = pdVar3[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  pdVar3 = (source->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  uVar4 = (source->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if ((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != uVar4) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4
               ,1);
    if ((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar4) {
LAB_007ff6f7:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar5 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar13 = uVar4 + 7;
  if (-1 < (long)uVar4) {
    uVar13 = uVar4;
  }
  uVar13 = uVar13 & 0xfffffffffffffff8;
  if (7 < (long)uVar4) {
    lVar14 = 0;
    do {
      pdVar1 = pdVar3 + lVar14;
      dVar6 = pdVar1[1];
      dVar7 = pdVar1[2];
      dVar8 = pdVar1[3];
      dVar9 = pdVar1[4];
      dVar10 = pdVar1[5];
      dVar11 = pdVar1[6];
      dVar12 = pdVar1[7];
      pdVar2 = pdVar5 + lVar14;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar6;
      pdVar2[2] = dVar7;
      pdVar2[3] = dVar8;
      pdVar2[4] = dVar9;
      pdVar2[5] = dVar10;
      pdVar2[6] = dVar11;
      pdVar2[7] = dVar12;
      lVar14 = lVar14 + 8;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar4) {
    do {
      pdVar5[uVar13] = pdVar3[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar4 != uVar13);
  }
  return;
}

Assistant:

ChLineNurbs::ChLineNurbs(const ChLineNurbs& source) : ChLine(source) {
    this->points = source.points;
    this->p = source.p;
    this->knots = source.knots;
    this->weights = source.weights;
}